

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportTargetCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  ostream *poVar3;
  char *pcVar4;
  string targetName;
  string local_50 [32];
  string local_30;
  
  std::__cxx11::string::string(local_50,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_30,target);
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::~string((string *)&local_30);
  poVar3 = std::operator<<(os,"# Create imported target ");
  poVar3 = std::operator<<(poVar3,local_50);
  std::operator<<(poVar3,"\n");
  TVar2 = cmGeneratorTarget::GetType(target);
  switch(TVar2) {
  case EXECUTABLE:
    poVar3 = std::operator<<(os,"add_executable(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " IMPORTED)\n";
    break;
  case STATIC_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " STATIC IMPORTED)\n";
    break;
  case SHARED_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " SHARED IMPORTED)\n";
    break;
  case MODULE_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " MODULE IMPORTED)\n";
    break;
  case OBJECT_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " OBJECT IMPORTED)\n";
    break;
  default:
    goto switchD_003719cf_caseD_5;
  case INTERFACE_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " INTERFACE IMPORTED)\n";
    break;
  case UNKNOWN_LIBRARY:
    poVar3 = std::operator<<(os,"add_library(");
    poVar3 = std::operator<<(poVar3,local_50);
    pcVar4 = " UNKNOWN IMPORTED)\n";
  }
  std::operator<<(poVar3,pcVar4);
switchD_003719cf_caseD_5:
  bVar1 = cmGeneratorTarget::IsExecutableWithExports(target);
  if (bVar1) {
    poVar3 = std::operator<<(os,"set_property(TARGET ");
    poVar3 = std::operator<<(poVar3,local_50);
    std::operator<<(poVar3," PROPERTY ENABLE_EXPORTS 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsFrameworkOnApple(target);
  if (bVar1) {
    poVar3 = std::operator<<(os,"set_property(TARGET ");
    poVar3 = std::operator<<(poVar3,local_50);
    std::operator<<(poVar3," PROPERTY FRAMEWORK 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target);
  if (bVar1) {
    poVar3 = std::operator<<(os,"set_property(TARGET ");
    poVar3 = std::operator<<(poVar3,local_50);
    std::operator<<(poVar3," PROPERTY MACOSX_BUNDLE 1)\n");
  }
  bVar1 = cmGeneratorTarget::IsCFBundleOnApple(target);
  if (bVar1) {
    poVar3 = std::operator<<(os,"set_property(TARGET ");
    poVar3 = std::operator<<(poVar3,local_50);
    std::operator<<(poVar3," PROPERTY BUNDLE 1)\n");
  }
  std::operator<<(os,"\n");
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }
  os << "\n";
}